

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgnxk(fitsfile *fptr,char **inclist,int ninc,char **exclist,int nexc,char *card,int *status)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int match;
  int exact;
  char keybuf [81];
  char keyname [75];
  int local_124;
  int local_120;
  int local_11c;
  long local_118;
  char *local_110;
  long local_108;
  fitsfile *local_100;
  char **local_f8;
  int local_ec;
  char local_e8 [96];
  char local_88 [88];
  
  *card = '\0';
  iVar2 = *status;
  if (iVar2 < 1) {
    local_120 = ninc;
    local_100 = fptr;
    local_f8 = inclist;
    iVar2 = ffgcrd(fptr,"*",local_e8,status);
    if (iVar2 < 1) {
      local_118 = (long)nexc;
      lVar5 = 0;
      if (0 < local_118) {
        lVar5 = local_118;
      }
      local_108 = (long)local_120;
      local_110 = card;
      do {
        ffgknm(local_e8,local_88,&local_11c,status);
        if (0 < local_120) {
          lVar3 = 0;
          do {
            ffcmps(local_f8[lVar3],local_88,0,&local_124,&local_ec);
            if (local_124 != 0) {
              lVar4 = -1;
              do {
                if (lVar4 - lVar5 == -1) goto LAB_0016f91d;
                lVar1 = lVar4 + 1;
                lVar4 = lVar4 + 1;
                ffcmps(exclist[lVar1],local_88,0,&local_124,&local_ec);
              } while (local_124 == 0);
              if (local_118 <= lVar4) {
LAB_0016f91d:
                strcat(local_110,local_e8);
                goto LAB_0016f934;
              }
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != local_108);
        }
        iVar2 = ffgcrd(local_100,"*",local_e8,status);
      } while (iVar2 < 1);
    }
LAB_0016f934:
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffgnxk( fitsfile *fptr,     /* I - FITS file pointer              */
            char **inclist,     /* I - list of included keyword names */
            int ninc,           /* I - number of names in inclist     */
            char **exclist,     /* I - list of excluded keyword names */
            int nexc,           /* I - number of names in exclist     */
            char *card,         /* O - first matching keyword         */
            int  *status)       /* IO - error status                  */
/*
    Return the next keyword that matches one of the names in inclist
    but does not match any of the names in exclist.  The search
    goes from the current position to the end of the header, only.
    Wild card characters may be used in the name lists ('*', '?' and '#').
*/
{
    int casesn, match, exact, namelen;
    long ii, jj;
    char keybuf[FLEN_CARD], keyname[FLEN_KEYWORD];

    card[0] = '\0';
    if (*status > 0)
        return(*status);

    casesn = FALSE;

    /* get next card, and return with an error if hit end of header */
    while( ffgcrd(fptr, "*", keybuf, status) <= 0)
    {
        ffgknm(keybuf, keyname, &namelen, status); /* get the keyword name */
        
        /* does keyword match any names in the include list? */
        for (ii = 0; ii < ninc; ii++)
        {
            ffcmps(inclist[ii], keyname, casesn, &match, &exact);
            if (match)
            {
                /* does keyword match any names in the exclusion list? */
                jj = -1;
                while ( ++jj < nexc )
                {
                    ffcmps(exclist[jj], keyname, casesn, &match, &exact);
                    if (match)
                        break;
                }

                if (jj >= nexc)
                {
                    /* not in exclusion list, so return this keyword */
                    strcat(card, keybuf);
                    return(*status);
                }
            }
        }
    }
    return(*status);
}